

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

bool isVariableIndexable(DWARFDie *Die,DWARFContext *DCtx)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  DWARFDebugLoc *this;
  LocationList *pLVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  ArrayRef<unsigned_char> D;
  ArrayRef<unsigned_char> D_00;
  ArrayRef<unsigned_char> D_01;
  ArrayRef<unsigned_char> D_02;
  ArrayRef<unsigned_char> D_03;
  ArrayRef<unsigned_char> D_04;
  ArrayRef<unsigned_char> D_05;
  ArrayRef<unsigned_char> D_06;
  Optional<unsigned_long> OVar11;
  ArrayRef<llvm::dwarf::Attribute> Attrs;
  undefined1 local_90 [8];
  Optional<llvm::DWARFFormValue> Location;
  Optional<llvm::ArrayRef<unsigned_char>_> Expr;
  
  Location.Storage.hasVal = true;
  Location.Storage._49_1_ = 0;
  Attrs.Length = 1;
  Attrs.Data = (Attribute *)&Location.Storage.hasVal;
  llvm::DWARFDie::findRecursively((Optional<llvm::DWARFFormValue> *)local_90,Die,Attrs);
  if (Location.Storage.field_0._40_1_ != '\x01') {
    return false;
  }
  llvm::DWARFFormValue::getAsBlock
            ((Optional<llvm::ArrayRef<unsigned_char>_> *)&Location.Storage.hasVal,
             (DWARFFormValue *)local_90);
  if (Expr.Storage.field_0.value.Length._0_1_ == '\x01') {
    D.Length._2_6_ = Location.Storage._50_6_;
    D.Length._0_1_ = Location.Storage.hasVal;
    D.Length._1_1_ = Location.Storage._49_1_;
    D.Data = (uchar *)(DCtx->DObj)._M_t.
                      super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                      .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                      ((anon_class_16_2_209e955a *)Die->U,D);
    if (!bVar4) {
      return false;
    }
    return true;
  }
  if (Location.Storage.field_0._40_1_ == '\0') {
    __assert_fail("hasVal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                  ,0xad,
                  "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
                 );
  }
  OVar11 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_90);
  if (((undefined1  [16])OVar11.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    return false;
  }
  this = llvm::DWARFContext::getDebugLoc(DCtx);
  if (this == (DWARFDebugLoc *)0x0) {
    return false;
  }
  pLVar5 = llvm::DWARFDebugLoc::getLocationListAtOffset(this,OVar11.Storage.field_0.value);
  if (pLVar5 == (LocationList *)0x0) {
    return false;
  }
  pvVar2 = (pLVar5->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
           BeginX;
  uVar1 = (pLVar5->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
          super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
          Size;
  uVar7 = (ulong)uVar1;
  uVar6 = uVar7;
  pvVar9 = pvVar2;
  if (3 < uVar7) {
    lVar8 = (ulong)(uVar1 >> 2) + 1;
    lVar10 = uVar7 * 0x28;
    pvVar3 = (void *)((long)pvVar2 + 0x50);
    do {
      pvVar9 = pvVar3;
      D_03.Length = *(size_type *)((long)pvVar9 + -0x40);
      D_03.Data = (uchar *)(DCtx->DObj)._M_t.
                           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)Die->U,D_03);
      if (bVar4) {
        pvVar9 = (void *)((long)pvVar9 + -0x50);
        goto LAB_00b10791;
      }
      D_04.Length = *(size_type *)((long)pvVar9 + -0x18);
      D_04.Data = (uchar *)(DCtx->DObj)._M_t.
                           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)Die->U,D_04);
      if (bVar4) {
        pvVar9 = (void *)((long)pvVar9 + -0x28);
        goto LAB_00b10791;
      }
      D_05.Length = *(size_type *)((long)pvVar9 + 0x10);
      D_05.Data = (uchar *)(DCtx->DObj)._M_t.
                           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)Die->U,D_05);
      if (bVar4) goto LAB_00b10791;
      D_06.Length = *(size_type *)((long)pvVar9 + 0x38);
      D_06.Data = (uchar *)(DCtx->DObj)._M_t.
                           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)Die->U,D_06);
      if (bVar4) {
        pvVar9 = (void *)((long)pvVar9 + 0x28);
        goto LAB_00b10791;
      }
      lVar8 = lVar8 + -1;
      lVar10 = lVar10 + -0xa0;
      pvVar3 = (void *)((long)pvVar9 + 0xa0);
    } while (1 < lVar8);
    uVar6 = (lVar10 >> 3) * -0x3333333333333333;
    pvVar9 = (void *)((long)pvVar9 + 0x50);
  }
  if (uVar6 != 1) {
    if (uVar6 != 2) {
      if (uVar6 != 3) {
        return false;
      }
      D_00.Length = *(size_type *)((long)pvVar9 + 0x10);
      D_00.Data = (uchar *)(DCtx->DObj)._M_t.
                           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)Die->U,D_00);
      if (bVar4) goto LAB_00b10791;
      pvVar9 = (void *)((long)pvVar9 + 0x28);
    }
    D_01.Length = *(size_type *)((long)pvVar9 + 0x10);
    D_01.Data = (uchar *)(DCtx->DObj)._M_t.
                         super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                         .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                      ((anon_class_16_2_209e955a *)Die->U,D_01);
    if (bVar4) goto LAB_00b10791;
    pvVar9 = (void *)((long)pvVar9 + 0x28);
  }
  D_02.Length = *(size_type *)((long)pvVar9 + 0x10);
  D_02.Data = (uchar *)(DCtx->DObj)._M_t.
                       super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                       .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  bVar4 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                    ((anon_class_16_2_209e955a *)Die->U,D_02);
  if (!bVar4) {
    return false;
  }
LAB_00b10791:
  if (pvVar9 == (void *)((long)pvVar2 + uVar7 * 0x28)) {
    return false;
  }
  return true;
}

Assistant:

static bool isVariableIndexable(const DWARFDie &Die, DWARFContext &DCtx) {
  Optional<DWARFFormValue> Location = Die.findRecursively(DW_AT_location);
  if (!Location)
    return false;

  auto ContainsInterestingOperators = [&](ArrayRef<uint8_t> D) {
    DWARFUnit *U = Die.getDwarfUnit();
    DataExtractor Data(toStringRef(D), DCtx.isLittleEndian(), U->getAddressByteSize());
    DWARFExpression Expression(Data, U->getVersion(), U->getAddressByteSize());
    return any_of(Expression, [](DWARFExpression::Operation &Op) {
      return !Op.isError() && (Op.getCode() == DW_OP_addr ||
                               Op.getCode() == DW_OP_form_tls_address ||
                               Op.getCode() == DW_OP_GNU_push_tls_address);
    });
  };

  if (Optional<ArrayRef<uint8_t>> Expr = Location->getAsBlock()) {
    // Inlined location.
    if (ContainsInterestingOperators(*Expr))
      return true;
  } else if (Optional<uint64_t> Offset = Location->getAsSectionOffset()) {
    // Location list.
    if (const DWARFDebugLoc *DebugLoc = DCtx.getDebugLoc()) {
      if (const DWARFDebugLoc::LocationList *LocList =
              DebugLoc->getLocationListAtOffset(*Offset)) {
        if (any_of(LocList->Entries, [&](const DWARFDebugLoc::Entry &E) {
              return ContainsInterestingOperators(E.Loc);
            }))
          return true;
      }
    }
  }
  return false;
}